

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

void __thiscall spdlog::spdlog_ex::~spdlog_ex(spdlog_ex *this)

{
  pointer pcVar1;
  
  *(undefined ***)this = &PTR__spdlog_ex_00153e88;
  pcVar1 = (this->msg_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->msg_).field_2) {
    operator_delete(pcVar1);
  }
  std::exception::~exception(&this->super_exception);
  operator_delete(this);
  return;
}

Assistant:

class SPDLOG_API spdlog_ex : public std::exception {
public:
    explicit spdlog_ex(std::string msg);
    spdlog_ex(const std::string &msg, int last_errno);
    const char *what() const SPDLOG_NOEXCEPT override;

private:
    std::string msg_;
}